

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::Server::write_response_core
          (Server *this,Stream *strm,bool close_connection,Request *req,Response *res,
          bool need_apply_ranges)

{
  bool bVar1;
  bool bVar2;
  HandlerResponse HVar3;
  int iVar4;
  ostream *poVar5;
  ssize_t sVar6;
  undefined4 extraout_var;
  string boundary;
  string content_type;
  stringstream ss;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [24];
  size_t local_190;
  
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/vendor/cpp-httplib/httplib.h"
                  ,0x13b2,
                  "bool httplib::Server::write_response_core(Stream &, bool, const Request &, Response &, bool)"
                 );
  }
  if ((399 < res->status) &&
     ((this->error_handler_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    HVar3 = std::
            function<httplib::Server::HandlerResponse_(const_httplib::Request_&,_httplib::Response_&)>
            ::operator()(&this->error_handler_,req,res);
    need_apply_ranges = HVar3 == Handled || need_apply_ranges;
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  local_1d8._M_string_length = 0;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1f8.field_2._M_local_buf[0] = '\0';
  if (need_apply_ranges != false) {
    apply_ranges(this,req,res,&local_1d8,&local_1f8);
  }
  if (close_connection) {
LAB_001362ee:
    Response::set_header(res,"Connection","close");
  }
  else {
    Request::get_header_value_abi_cxx11_((string *)local_1b8,req,"Connection",0);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1b8,"close");
    std::__cxx11::string::~string((string *)local_1b8);
    if (bVar1) goto LAB_001362ee;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    poVar5 = std::operator<<((ostream *)local_1a8,"timeout=");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5,", max=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__cxx11::stringbuf::str();
    Response::set_header(res,"Keep-Alive",&local_218);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  }
  bVar1 = Response::has_header(res,"Content-Type");
  if ((!bVar1) &&
     ((((res->body)._M_string_length != 0 || (res->content_length_ != 0)) ||
      ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0)))) {
    Response::set_header(res,"Content-Type","text/plain");
  }
  bVar1 = Response::has_header(res,"Content-Length");
  if (((!bVar1) && ((res->body)._M_string_length == 0)) &&
     ((res->content_length_ == 0 &&
      ((res->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0)))) {
    Response::set_header(res,"Content-Length","0");
  }
  bVar1 = Response::has_header(res,"Accept-Ranges");
  if (!bVar1) {
    bVar1 = std::operator==(&req->method,"HEAD");
    if (bVar1) {
      Response::set_header(res,"Accept-Ranges","bytes");
    }
  }
  if ((this->post_routing_handler_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              (&this->post_routing_handler_,req,res);
  }
  local_1b8._8_8_ = local_1a8 + 8;
  local_1b8._0_8_ = &PTR__BufferStream_0016c228;
  local_1a8._0_8_ = 0;
  local_1a8[8] = '\0';
  local_190 = 0;
  local_218._M_dataplus._M_p = detail::status_message(res->status);
  sVar6 = Stream::write_format<int,char_const*>
                    ((Stream *)local_1b8,"HTTP/1.1 %d %s\r\n",&res->status,(char **)&local_218);
  if (sVar6 != 0) {
    sVar6 = detail::write_headers((Stream *)local_1b8,&res->headers);
    if (sVar6 != 0) {
      (*strm->_vptr_Stream[5])(strm,local_1b8._8_8_,local_1a8._0_8_);
      detail::BufferStream::~BufferStream((BufferStream *)local_1b8);
      bVar2 = std::operator!=(&req->method,"HEAD");
      bVar1 = true;
      if (bVar2) {
        if ((res->body)._M_string_length == 0) {
          if ((res->content_provider_).super__Function_base._M_manager != (_Manager_type)0x0) {
            bVar2 = write_content_with_provider(this,strm,req,res,&local_1f8,&local_1d8);
            if (bVar2) {
              res->content_provider_success_ = true;
            }
            else {
              res->content_provider_success_ = false;
              bVar1 = false;
            }
          }
        }
        else {
          iVar4 = (*strm->_vptr_Stream[5])(strm,(res->body)._M_dataplus._M_p);
          bVar1 = CONCAT44(extraout_var,iVar4) != 0;
        }
      }
      if ((this->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
        std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
                  (&this->logger_,req,res);
      }
      goto LAB_00136545;
    }
  }
  detail::BufferStream::~BufferStream((BufferStream *)local_1b8);
  bVar1 = false;
LAB_00136545:
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  return bVar1;
}

Assistant:

inline bool Server::write_response_core(Stream &strm, bool close_connection,
                                        const Request &req, Response &res,
                                        bool need_apply_ranges) {
  assert(res.status != -1);

  if (400 <= res.status && error_handler_ &&
      error_handler_(req, res) == HandlerResponse::Handled) {
    need_apply_ranges = true;
  }

  std::string content_type;
  std::string boundary;
  if (need_apply_ranges) { apply_ranges(req, res, content_type, boundary); }

  // Prepare additional headers
  if (close_connection || req.get_header_value("Connection") == "close") {
    res.set_header("Connection", "close");
  } else {
    std::stringstream ss;
    ss << "timeout=" << keep_alive_timeout_sec_
       << ", max=" << keep_alive_max_count_;
    res.set_header("Keep-Alive", ss.str());
  }

  if (!res.has_header("Content-Type") &&
      (!res.body.empty() || res.content_length_ > 0 || res.content_provider_)) {
    res.set_header("Content-Type", "text/plain");
  }

  if (!res.has_header("Content-Length") && res.body.empty() &&
      !res.content_length_ && !res.content_provider_) {
    res.set_header("Content-Length", "0");
  }

  if (!res.has_header("Accept-Ranges") && req.method == "HEAD") {
    res.set_header("Accept-Ranges", "bytes");
  }

  if (post_routing_handler_) { post_routing_handler_(req, res); }

  // Response line and headers
  {
    detail::BufferStream bstrm;

    if (!bstrm.write_format("HTTP/1.1 %d %s\r\n", res.status,
                            detail::status_message(res.status))) {
      return false;
    }

    if (!detail::write_headers(bstrm, res.headers)) { return false; }

    // Flush buffer
    auto &data = bstrm.get_buffer();
    strm.write(data.data(), data.size());
  }

  // Body
  auto ret = true;
  if (req.method != "HEAD") {
    if (!res.body.empty()) {
      if (!strm.write(res.body)) { ret = false; }
    } else if (res.content_provider_) {
      if (write_content_with_provider(strm, req, res, boundary, content_type)) {
        res.content_provider_success_ = true;
      } else {
        res.content_provider_success_ = false;
        ret = false;
      }
    }
  }

  // Log
  if (logger_) { logger_(req, res); }

  return ret;
}